

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QMakeLocalFileName>::emplace<QMakeLocalFileName>
          (QGenericArrayOps<QMakeLocalFileName> *this,qsizetype i,QMakeLocalFileName *args)

{
  qsizetype *pqVar1;
  QMakeLocalFileName **ppQVar2;
  Data *pDVar3;
  long lVar4;
  QMakeLocalFileName *pQVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  long in_FS_OFFSET;
  bool bVar12;
  Inserter local_a8;
  QMakeLocalFileName local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QMakeLocalFileName>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00188ee8:
    local_58.real_name.d.d = (args->real_name).d.d;
    local_58.real_name.d.ptr = (args->real_name).d.ptr;
    (args->real_name).d.d = (Data *)0x0;
    (args->real_name).d.ptr = (char16_t *)0x0;
    local_58.real_name.d.size = (args->real_name).d.size;
    (args->real_name).d.size = 0;
    local_58.local_name.d.d = (args->local_name).d.d;
    local_58.local_name.d.ptr = (args->local_name).d.ptr;
    (args->local_name).d.d = (Data *)0x0;
    (args->local_name).d.ptr = (char16_t *)0x0;
    local_58.local_name.d.size = (args->local_name).d.size;
    (args->local_name).d.size = 0;
    bVar12 = (this->super_QArrayDataPointer<QMakeLocalFileName>).size != 0;
    QArrayDataPointer<QMakeLocalFileName>::detachAndGrow
              (&this->super_QArrayDataPointer<QMakeLocalFileName>,(uint)(i == 0 && bVar12),1,
               (QMakeLocalFileName **)0x0,(QArrayDataPointer<QMakeLocalFileName> *)0x0);
    qVar11 = local_58.local_name.d.size;
    pcVar10 = local_58.local_name.d.ptr;
    pDVar9 = local_58.local_name.d.d;
    qVar8 = local_58.real_name.d.size;
    pcVar7 = local_58.real_name.d.ptr;
    pDVar6 = local_58.real_name.d.d;
    if (i == 0 && bVar12) {
      pQVar5 = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
      local_58.real_name.d.d = (Data *)0x0;
      pQVar5[-1].real_name.d.d = pDVar6;
      local_58.real_name.d.ptr = (char16_t *)0x0;
      pQVar5[-1].real_name.d.ptr = pcVar7;
      local_58.real_name.d.size = 0;
      pQVar5[-1].real_name.d.size = qVar8;
      local_58.local_name.d.d = (Data *)0x0;
      pQVar5[-1].local_name.d.d = pDVar9;
      local_58.local_name.d.ptr = (char16_t *)0x0;
      pQVar5[-1].local_name.d.ptr = pcVar10;
      local_58.local_name.d.size = 0;
      pQVar5[-1].local_name.d.size = qVar11;
      (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr = pQVar5 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      local_a8.sourceCopyConstruct = 0;
      local_a8.nSource = 0;
      local_a8.move = 0;
      local_a8.sourceCopyAssign = 0;
      local_a8.end = (QMakeLocalFileName *)0x0;
      local_a8.last = (QMakeLocalFileName *)0x0;
      local_a8.where = (QMakeLocalFileName *)0x0;
      local_a8.begin = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
      local_a8.size = (this->super_QArrayDataPointer<QMakeLocalFileName>).size;
      local_a8.data = &this->super_QArrayDataPointer<QMakeLocalFileName>;
      Inserter::insertOne(&local_a8,i,&local_58);
      (local_a8.data)->ptr = local_a8.begin;
      (local_a8.data)->size = local_a8.size;
    }
    if (&(local_58.local_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_58.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_58.local_name.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_58.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_58.real_name.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QMakeLocalFileName>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QMakeLocalFileName>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      pQVar5 = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
      pDVar6 = (args->real_name).d.d;
      (args->real_name).d.d = (Data *)0x0;
      pQVar5[lVar4].real_name.d.d = pDVar6;
      pcVar7 = (args->real_name).d.ptr;
      (args->real_name).d.ptr = (char16_t *)0x0;
      pQVar5[lVar4].real_name.d.ptr = pcVar7;
      qVar8 = (args->real_name).d.size;
      (args->real_name).d.size = 0;
      pQVar5[lVar4].real_name.d.size = qVar8;
      pDVar6 = (args->local_name).d.d;
      (args->local_name).d.d = (Data *)0x0;
      pQVar5[lVar4].local_name.d.d = pDVar6;
      pcVar7 = (args->local_name).d.ptr;
      (args->local_name).d.ptr = (char16_t *)0x0;
      pQVar5[lVar4].local_name.d.ptr = pcVar7;
      qVar8 = (args->local_name).d.size;
      (args->local_name).d.size = 0;
      pQVar5[lVar4].local_name.d.size = qVar8;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QMakeLocalFileName *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr)) goto LAB_00188ee8;
      pQVar5 = (this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
      pDVar6 = (args->real_name).d.d;
      (args->real_name).d.d = (Data *)0x0;
      pQVar5[-1].real_name.d.d = pDVar6;
      pcVar7 = (args->real_name).d.ptr;
      (args->real_name).d.ptr = (char16_t *)0x0;
      pQVar5[-1].real_name.d.ptr = pcVar7;
      qVar8 = (args->real_name).d.size;
      (args->real_name).d.size = 0;
      pQVar5[-1].real_name.d.size = qVar8;
      pDVar6 = (args->local_name).d.d;
      (args->local_name).d.d = (Data *)0x0;
      pQVar5[-1].local_name.d.d = pDVar6;
      pcVar7 = (args->local_name).d.ptr;
      (args->local_name).d.ptr = (char16_t *)0x0;
      pQVar5[-1].local_name.d.ptr = pcVar7;
      qVar8 = (args->local_name).d.size;
      (args->local_name).d.size = 0;
      pQVar5[-1].local_name.d.size = qVar8;
      ppQVar2 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<QMakeLocalFileName>).size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }